

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int patchtestreg(FuncState *fs,int node,int reg)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  
  puVar2 = (uint *)((long)&fs->f + (long)node * 4);
  if ((node < 1) || (uVar3 = puVar2[-1], ("\b\n\n\t\t\b\b\b\b\b"[uVar3 & 0x7f] & 0x10) == 0)) {
    uVar3 = *puVar2;
  }
  else {
    puVar2 = puVar2 + -1;
  }
  iVar1 = 0;
  if ((uVar3 & 0x7f) == 0x43) {
    if ((reg == 0xff) || ((uVar3 >> 0x10 & 0xff) == reg)) {
      uVar3 = uVar3 & 0x8042 | uVar3 >> 9 & 0x7f80;
    }
    else {
      uVar3 = (reg & 0xffU) << 7 | uVar3 & 0xffff8043;
    }
    *puVar2 = uVar3;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int patchtestreg (FuncState *fs, int node, int reg) {
  Instruction *i = getjumpcontrol(fs, node);
  if (GET_OPCODE(*i) != OP_TESTSET)
    return 0;  /* cannot patch other instructions */
  if (reg != NO_REG && reg != GETARG_B(*i))
    SETARG_A(*i, reg);
  else {
     /* no register to put value or register already has the value;
        change instruction to simple test */
    *i = CREATE_ABCk(OP_TEST, GETARG_B(*i), 0, 0, GETARG_k(*i));
  }
  return 1;
}